

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefaultConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultConfigRuleSyntax,slang::parsing::Token,slang::syntax::ConfigLiblistSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ConfigLiblistSyntax *args_1,Token *args_2)

{
  Token semi;
  Token defaultKeyword;
  DefaultConfigRuleSyntax *pDVar1;
  Info *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pDVar1 = (DefaultConfigRuleSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  defaultKeyword.info = in_RSI;
  defaultKeyword.kind = (short)in_RDX;
  defaultKeyword._2_1_ = (char)((ulong)in_RDX >> 0x10);
  defaultKeyword.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  defaultKeyword.rawLen = (int)((ulong)in_RDX >> 0x20);
  semi.info = in_RCX;
  semi._0_8_ = in_RSI->location;
  slang::syntax::DefaultConfigRuleSyntax::DefaultConfigRuleSyntax
            ((DefaultConfigRuleSyntax *)in_RSI->rawTextPtr,defaultKeyword,
             (ConfigLiblistSyntax *)in_RCX->location,semi);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }